

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstringbuilder.h
# Opt level: O2

void __thiscall
QStringBuilder<QStringBuilder<QStringBuilder<QByteArrayView,_QByteArray>,_char>,_QByteArray>::
~QStringBuilder(QStringBuilder<QStringBuilder<QStringBuilder<QByteArrayView,_QByteArray>,_char>,_QByteArray>
                *this)

{
  QArrayDataPointer<char>::~QArrayDataPointer(&(this->b).d);
  QArrayDataPointer<char>::~QArrayDataPointer(&(this->a).a.b.d);
  return;
}

Assistant:

~QStringBuilder() = default;